

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Gia_Obj_t * Gia_ObjRecognizeMux(Gia_Obj_t *pNode,Gia_Obj_t **ppNodeT,Gia_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pNode1;
  Gia_Obj_t *pNode0;
  Gia_Obj_t **ppNodeE_local;
  Gia_Obj_t **ppNodeT_local;
  Gia_Obj_t *pNode_local;
  
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x3c2,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  iVar1 = Gia_ObjIsMuxType(pNode);
  if (iVar1 != 0) {
    pGVar3 = Gia_ObjFanin0(pNode);
    pGVar4 = Gia_ObjFanin1(pNode);
    pGVar5 = Gia_ObjFanin1(pGVar3);
    pGVar6 = Gia_ObjFanin1(pGVar4);
    if (pGVar5 == pGVar6) {
      iVar1 = Gia_ObjFaninC1(pGVar3);
      iVar2 = Gia_ObjFaninC1(pGVar4);
      if (iVar1 != iVar2) {
        iVar1 = Gia_ObjFaninC1(pGVar3);
        if (iVar1 != 0) {
          pGVar5 = Gia_ObjChild0(pGVar4);
          pGVar5 = Gia_Not(pGVar5);
          *ppNodeT = pGVar5;
          pGVar3 = Gia_ObjChild0(pGVar3);
          pGVar3 = Gia_Not(pGVar3);
          *ppNodeE = pGVar3;
          pGVar3 = Gia_ObjChild1(pGVar4);
          return pGVar3;
        }
        pGVar5 = Gia_ObjChild0(pGVar3);
        pGVar5 = Gia_Not(pGVar5);
        *ppNodeT = pGVar5;
        pGVar4 = Gia_ObjChild0(pGVar4);
        pGVar4 = Gia_Not(pGVar4);
        *ppNodeE = pGVar4;
        pGVar3 = Gia_ObjChild1(pGVar3);
        return pGVar3;
      }
    }
    pGVar5 = Gia_ObjFanin0(pGVar3);
    pGVar6 = Gia_ObjFanin0(pGVar4);
    if (pGVar5 == pGVar6) {
      iVar1 = Gia_ObjFaninC0(pGVar3);
      iVar2 = Gia_ObjFaninC0(pGVar4);
      if (iVar1 != iVar2) {
        iVar1 = Gia_ObjFaninC0(pGVar3);
        if (iVar1 != 0) {
          pGVar5 = Gia_ObjChild1(pGVar4);
          pGVar5 = Gia_Not(pGVar5);
          *ppNodeT = pGVar5;
          pGVar3 = Gia_ObjChild1(pGVar3);
          pGVar3 = Gia_Not(pGVar3);
          *ppNodeE = pGVar3;
          pGVar3 = Gia_ObjChild0(pGVar4);
          return pGVar3;
        }
        pGVar5 = Gia_ObjChild1(pGVar3);
        pGVar5 = Gia_Not(pGVar5);
        *ppNodeT = pGVar5;
        pGVar4 = Gia_ObjChild1(pGVar4);
        pGVar4 = Gia_Not(pGVar4);
        *ppNodeE = pGVar4;
        pGVar3 = Gia_ObjChild0(pGVar3);
        return pGVar3;
      }
    }
    pGVar5 = Gia_ObjFanin0(pGVar3);
    pGVar6 = Gia_ObjFanin1(pGVar4);
    if (pGVar5 == pGVar6) {
      iVar1 = Gia_ObjFaninC0(pGVar3);
      iVar2 = Gia_ObjFaninC1(pGVar4);
      if (iVar1 != iVar2) {
        iVar1 = Gia_ObjFaninC0(pGVar3);
        if (iVar1 != 0) {
          pGVar5 = Gia_ObjChild0(pGVar4);
          pGVar5 = Gia_Not(pGVar5);
          *ppNodeT = pGVar5;
          pGVar3 = Gia_ObjChild1(pGVar3);
          pGVar3 = Gia_Not(pGVar3);
          *ppNodeE = pGVar3;
          pGVar3 = Gia_ObjChild1(pGVar4);
          return pGVar3;
        }
        pGVar5 = Gia_ObjChild1(pGVar3);
        pGVar5 = Gia_Not(pGVar5);
        *ppNodeT = pGVar5;
        pGVar4 = Gia_ObjChild0(pGVar4);
        pGVar4 = Gia_Not(pGVar4);
        *ppNodeE = pGVar4;
        pGVar3 = Gia_ObjChild0(pGVar3);
        return pGVar3;
      }
    }
    pGVar5 = Gia_ObjFanin1(pGVar3);
    pGVar6 = Gia_ObjFanin0(pGVar4);
    if (pGVar5 == pGVar6) {
      iVar1 = Gia_ObjFaninC1(pGVar3);
      iVar2 = Gia_ObjFaninC0(pGVar4);
      if (iVar1 != iVar2) {
        iVar1 = Gia_ObjFaninC1(pGVar3);
        if (iVar1 == 0) {
          pGVar5 = Gia_ObjChild0(pGVar3);
          pGVar5 = Gia_Not(pGVar5);
          *ppNodeT = pGVar5;
          pGVar4 = Gia_ObjChild1(pGVar4);
          pGVar4 = Gia_Not(pGVar4);
          *ppNodeE = pGVar4;
          pNode_local = Gia_ObjChild1(pGVar3);
        }
        else {
          pGVar5 = Gia_ObjChild1(pGVar4);
          pGVar5 = Gia_Not(pGVar5);
          *ppNodeT = pGVar5;
          pGVar3 = Gia_ObjChild0(pGVar3);
          pGVar3 = Gia_Not(pGVar3);
          *ppNodeE = pGVar3;
          pNode_local = Gia_ObjChild0(pGVar4);
        }
        return pNode_local;
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x409,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  __assert_fail("Gia_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                ,0x3c3,"Gia_Obj_t *Gia_ObjRecognizeMux(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
}

Assistant:

Gia_Obj_t * Gia_ObjRecognizeMux( Gia_Obj_t * pNode, Gia_Obj_t ** ppNodeT, Gia_Obj_t ** ppNodeE )
{
    Gia_Obj_t * pNode0, * pNode1;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Gia_ObjFanin0(pNode);
    pNode1 = Gia_ObjFanin1(pNode);

    // find the control variable
    if ( Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p2) )
        if ( Gia_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            return Gia_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            return Gia_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p1) )
        if ( Gia_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            return Gia_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            return Gia_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p1) )
        if ( Gia_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            return Gia_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode1));//pNode2->p1);
            return Gia_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1)) )
    {
//        if ( FrGia_IsComplement(pNode1->p2) )
        if ( Gia_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            return Gia_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Gia_Not(Gia_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Gia_Not(Gia_ObjChild1(pNode1));//pNode2->p2);
            return Gia_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}